

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# provider.cpp
# Opt level: O2

Provider * parseProvider(Provider *__return_storage_ptr__,QString *filename)

{
  Data *pDVar1;
  bool bVar2;
  bool bVar3;
  qsizetype qVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  qsizetype qVar8;
  QRegularExpressionMatch QVar9;
  bool bVar10;
  int iVar11;
  int iVar12;
  QString *pQVar13;
  QString *pQVar14;
  undefined4 uVar15;
  uint uVar16;
  char16_t *pcVar17;
  long lVar18;
  int __oflag;
  char *pcVar19;
  QString *offset;
  bool bVar20;
  Data *pDVar21;
  char *fmt;
  TraceEnum *s1;
  TraceFlags *s1_00;
  long lVar22;
  int lineNumber;
  uint uVar23;
  long in_FS_OFFSET;
  QLatin1StringView s_00;
  QLatin1StringView s_01;
  uint local_428;
  uint local_424;
  uint local_41c;
  Tracepoint local_3c8;
  QArrayDataPointer<QString> local_378;
  QArrayDataPointer<char16_t> local_358;
  QArrayDataPointer<char16_t> local_338;
  QRegularExpressionMatch match;
  QArrayDataPointer<char16_t> local_318;
  TraceFlags local_2f8;
  QTextStream s;
  QIODevice local_2b8;
  QArrayDataPointer<char16_t> local_2a0;
  QArrayDataPointer<char16_t> local_288;
  QRegularExpressionMatch m;
  QArrayDataPointer<char16_t> local_230;
  QArrayDataPointer<char16_t> local_218;
  QArrayDataPointer<char16_t> local_1f8;
  QRegularExpressionMatch match_2;
  QArrayDataPointer<char16_t> local_1d8;
  QArrayDataPointer<char16_t> local_1c0;
  QArrayDataPointer<char16_t> local_1a8;
  QArrayDataPointer<char16_t> local_190;
  QArrayDataPointer<char16_t> local_178;
  undefined1 local_158 [64];
  TraceEnum local_118;
  Field local_d8;
  QRegularExpressionMatch match_1;
  char16_t *pcStack_70;
  QString QStack_60;
  int local_48;
  undefined4 uStack_44;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_2b8._vptr_QIODevice = (_func_int **)&DAT_aaaaaaaaaaaaaaaa;
  local_2b8.d_ptr._M_t.
  super___uniq_ptr_impl<QIODevicePrivate,_std::default_delete<QIODevicePrivate>_>._M_t.
  super__Tuple_impl<0UL,_QIODevicePrivate_*,_std::default_delete<QIODevicePrivate>_>.
  super__Head_base<0UL,_QIODevicePrivate_*,_false>._M_head_impl =
       (__uniq_ptr_data<QIODevicePrivate,_std::default_delete<QIODevicePrivate>,_true,_true>)
       &DAT_aaaaaaaaaaaaaaaa;
  QFile::QFile((QFile *)&local_2b8,filename);
  iVar11 = QFile::open((QFile *)&local_2b8,(char *)0x11,__oflag);
  if ((char)iVar11 == '\0') {
    QString::toLocal8Bit((QByteArray *)&local_d8,filename);
    pDVar21 = local_d8.paramType.d.d;
    if (local_d8.paramType.d.d == (Data *)0x0) {
      pDVar21 = (Data *)"";
    }
    QIODevice::errorString((QString *)&match_1,&local_2b8);
    QString::toLocal8Bit((QByteArray *)&local_3c8,(QString *)&match_1);
    pcVar19 = (char *)local_3c8.name.d.ptr;
    if ((Data *)local_3c8.name.d.ptr == (Data *)0x0) {
      pcVar19 = "";
    }
    panic("Cannot open %s: %s",pDVar21,pcVar19);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_3c8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&match_1);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_d8);
  }
  s.d_ptr._M_t.super___uniq_ptr_impl<QTextStreamPrivate,_std::default_delete<QTextStreamPrivate>_>.
  _M_t.super__Tuple_impl<0UL,_QTextStreamPrivate_*,_std::default_delete<QTextStreamPrivate>_>.
  super__Head_base<0UL,_QTextStreamPrivate_*,_false>._M_head_impl =
       (unique_ptr<QTextStreamPrivate,_std::default_delete<QTextStreamPrivate>_>)
       &DAT_aaaaaaaaaaaaaaaa;
  QTextStream::QTextStream(&s,&local_2b8);
  if ((parseProvider(QString_const&)::tracedef == '\0') &&
     (iVar11 = __cxa_guard_acquire(&parseProvider(QString_const&)::tracedef), iVar11 != 0)) {
    local_d8._0_8_ = (Data *)0x0;
    local_3c8.name.d.d = (Data *)0x0;
    local_3c8.name.d.ptr = (char16_t *)0x0;
    local_d8.paramType.d.d = (Data *)0x131c12;
    local_3c8.name.d.size = 0;
    local_d8.paramType.d.ptr = (char16_t *)0x21;
    QRegularExpression::QRegularExpression
              (&parseProvider::tracedef,(QString *)&local_d8,(PatternOptions)0x0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_d8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_3c8);
    __cxa_atexit(QRegularExpression::~QRegularExpression,&parseProvider::tracedef,&__dso_handle);
    __cxa_guard_release(&parseProvider(QString_const&)::tracedef);
  }
  if ((parseProvider(QString_const&)::enumenddef == '\0') &&
     (iVar11 = __cxa_guard_acquire(&parseProvider(QString_const&)::enumenddef), iVar11 != 0)) {
    local_d8._0_8_ = (Data *)0x0;
    local_3c8.name.d.d = (Data *)0x0;
    local_3c8.name.d.ptr = (char16_t *)0x0;
    local_d8.paramType.d.d = (Data *)0x131c56;
    local_3c8.name.d.size = 0;
    local_d8.paramType.d.ptr = (char16_t *)0x1d;
    QRegularExpression::QRegularExpression
              (&parseProvider::enumenddef,(QString *)&local_d8,(PatternOptions)0x0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_d8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_3c8);
    __cxa_atexit(QRegularExpression::~QRegularExpression,&parseProvider::enumenddef,&__dso_handle);
    __cxa_guard_release(&parseProvider(QString_const&)::enumenddef);
  }
  if ((parseProvider(QString_const&)::enumdef == '\0') &&
     (iVar11 = __cxa_guard_acquire(&parseProvider(QString_const&)::enumdef), iVar11 != 0)) {
    local_d8._0_8_ = (Data *)0x0;
    local_3c8.name.d.d = (Data *)0x0;
    local_3c8.name.d.ptr = (char16_t *)0x0;
    local_d8.paramType.d.d = (Data *)0x131c92;
    local_3c8.name.d.size = 0;
    local_d8.paramType.d.ptr = (char16_t *)0x2f;
    QRegularExpression::QRegularExpression
              (&parseProvider::enumdef,(QString *)&local_d8,(PatternOptions)0x0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_d8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_3c8);
    __cxa_atexit(QRegularExpression::~QRegularExpression,&parseProvider::enumdef,&__dso_handle);
    __cxa_guard_release(&parseProvider(QString_const&)::enumdef);
  }
  if ((parseProvider(QString_const&)::rangedef == '\0') &&
     (iVar11 = __cxa_guard_acquire(&parseProvider(QString_const&)::rangedef), iVar11 != 0)) {
    local_d8._0_8_ = (Data *)0x0;
    local_3c8.name.d.d = (Data *)0x0;
    local_3c8.name.d.ptr = (char16_t *)0x0;
    local_d8.paramType.d.d = (Data *)0x131cf2;
    local_3c8.name.d.size = 0;
    local_d8.paramType.d.ptr = (char16_t *)0x3f;
    QRegularExpression::QRegularExpression
              (&parseProvider::rangedef,(QString *)&local_d8,(PatternOptions)0x0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_d8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_3c8);
    __cxa_atexit(QRegularExpression::~QRegularExpression,&parseProvider::rangedef,&__dso_handle);
    __cxa_guard_release(&parseProvider(QString_const&)::rangedef);
  }
  (__return_storage_ptr__->flags).d.d = (Data *)0x0;
  (__return_storage_ptr__->flags).d.ptr = (TraceFlags *)0x0;
  (__return_storage_ptr__->enumerations).d.ptr = (TraceEnum *)0x0;
  (__return_storage_ptr__->enumerations).d.size = 0;
  (__return_storage_ptr__->prefixText).d.size = 0;
  (__return_storage_ptr__->enumerations).d.d = (Data *)0x0;
  (__return_storage_ptr__->prefixText).d.d = (Data *)0x0;
  (__return_storage_ptr__->prefixText).d.ptr = (QString *)0x0;
  (__return_storage_ptr__->tracepoints).d.ptr = (Tracepoint *)0x0;
  (__return_storage_ptr__->tracepoints).d.size = 0;
  (__return_storage_ptr__->flags).d.size = 0;
  (__return_storage_ptr__->name).d.size = 0;
  (__return_storage_ptr__->tracepoints).d.d = (Data *)0x0;
  (__return_storage_ptr__->name).d.d = (Data *)0x0;
  (__return_storage_ptr__->name).d.ptr = (char16_t *)0x0;
  QFileInfo::QFileInfo((QFileInfo *)&local_3c8,filename);
  QFileInfo::baseName((QString *)&local_d8,(QFileInfo *)&local_3c8);
  pDVar21 = (__return_storage_ptr__->name).d.d;
  pDVar1 = (Data *)(__return_storage_ptr__->name).d.ptr;
  (__return_storage_ptr__->name).d.d = (Data *)local_d8._0_8_;
  (__return_storage_ptr__->name).d.ptr = (char16_t *)local_d8.paramType.d.d;
  pcVar17 = (char16_t *)(__return_storage_ptr__->name).d.size;
  (__return_storage_ptr__->name).d.size = (qsizetype)local_d8.paramType.d.ptr;
  local_d8._0_8_ = pDVar21;
  local_d8.paramType.d.d = pDVar1;
  local_d8.paramType.d.ptr = pcVar17;
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_d8);
  QFileInfo::~QFileInfo((QFileInfo *)&local_3c8);
  local_158._48_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_158._0_8_ = (Data *)0x0;
  local_158._8_8_ = (Data *)0x0;
  local_158._16_8_ = (char16_t *)0x0;
  local_158._24_8_ = (Data *)0x0;
  local_158._32_8_ = (EnumValue *)0x0;
  local_158._40_8_ = 0;
  local_2f8.values.d.ptr = (FlagValue *)0x0;
  local_2f8.values.d.size = 0;
  local_2f8.name.d.size = 0;
  local_2f8.values.d.d = (Data *)0x0;
  local_2f8.name.d.d = (Data *)0x0;
  local_2f8.name.d.ptr = (char16_t *)0x0;
  uVar23 = 1;
  local_424 = 0x7fffffff;
  local_428 = 0x80000000;
  local_41c = 0;
  bVar2 = false;
  bVar3 = false;
  bVar20 = false;
  do {
    bVar10 = QTextStream::atEnd(&s);
    if (bVar10) {
      if (bVar20) {
        QString::toLocal8Bit((QByteArray *)&local_d8,filename);
        pDVar21 = local_d8.paramType.d.d;
        if (local_d8.paramType.d.d == (Data *)0x0) {
          pDVar21 = (Data *)"";
        }
        panic("Syntax error while processing \'%s\': no closing brace found for prefix text block",
              pDVar21);
        QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_d8);
      }
      TraceFlags::~TraceFlags(&local_2f8);
      TraceEnum::~TraceEnum((TraceEnum *)local_158);
      QTextStream::~QTextStream(&s);
      QFile::~QFile((QFile *)&local_2b8);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return __return_storage_ptr__;
      }
      __stack_chk_fail();
    }
    local_318.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_318.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_318.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QTextStream::readLine((QString *)&local_d8,&s,0);
    QString::trimmed_helper((QString *)&local_318,(QString *)&local_d8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_d8);
    local_d8._0_8_ = "{";
    local_d8.paramType.d.d = (Data *)0x1;
    bVar10 = operator==((QString *)&local_318,(QLatin1StringView *)&local_d8);
    if (bVar10) {
      bVar20 = true;
    }
    else if (bVar20) {
      local_d8._0_8_ = "}";
      local_d8.paramType.d.d = (Data *)0x1;
      bVar10 = operator==((QString *)&local_318,(QLatin1StringView *)&local_d8);
      if (bVar10) {
        bVar20 = false;
      }
      else {
        QList<QString>::emplaceBack<QString_const&>
                  (&__return_storage_ptr__->prefixText,(QString *)&local_318);
      }
    }
    else {
      local_d8._0_8_ = "ENUM {";
      local_d8.paramType.d.d = (Data *)0x6;
      bVar10 = operator==((QString *)&local_318,(QLatin1StringView *)&local_d8);
      if (bVar10) {
        bVar2 = true;
      }
      else {
        local_d8._0_8_ = "FLAGS {";
        local_d8.paramType.d.d = (Data *)0x7;
        bVar10 = operator==((QString *)&local_318,(QLatin1StringView *)&local_d8);
        if (bVar10) {
          bVar3 = true;
        }
        else {
          s_00.m_size = 1;
          s_00.m_data = "}";
          bVar10 = QString::startsWith((QString *)&local_318,s_00,CaseSensitive);
          if ((bVar10) && ((bVar2 || (bVar3)))) {
            match_1.d.d.ptr =
                 (QExplicitlySharedDataPointer<QRegularExpressionMatchPrivate>)&DAT_aaaaaaaaaaaaaaaa
            ;
            QRegularExpression::match
                      ((QRegularExpression *)&match_1,(QString *)&parseProvider::enumenddef,
                       (qsizetype)&local_318,NormalMatch,(MatchOptions)0x0);
            bVar10 = QRegularExpressionMatch::hasMatch(&match_1);
            if (bVar10) {
              if (bVar2) {
                QRegularExpressionMatch::captured((QString *)&local_d8,&match_1,1);
                uVar7 = local_158._16_8_;
                uVar6 = local_158._8_8_;
                uVar5 = local_158._0_8_;
                local_158._0_8_ = local_d8._0_8_;
                local_158._8_8_ = local_d8.paramType.d.d;
                local_d8._0_8_ = uVar5;
                local_d8.paramType.d.d = (Data *)uVar6;
                local_158._16_8_ = local_d8.paramType.d.ptr;
                local_d8.paramType.d.ptr = (char16_t *)uVar7;
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)&local_d8);
                if ((int)local_424 < 0) {
                  if (((0x7f < (int)local_428) || (iVar11 = 8, local_424 < 0xffffff80)) &&
                     (iVar11 = (uint)(local_424 < 0xffff8000) * 0x10 + 0x10, 0x7fff < (int)local_428
                     )) {
                    iVar11 = 0x20;
                  }
                }
                else {
                  iVar11 = 8;
                  if (0xff < (int)local_428) {
                    iVar11 = (uint)(0xffff < local_428) * 0x10 + 0x10;
                  }
                }
                local_158._48_4_ = iVar11;
                QList<TraceEnum>::emplaceBack<TraceEnum_const&>
                          (&__return_storage_ptr__->enumerations,(TraceEnum *)local_158);
                local_d8.name.d.d = (Data *)0x0;
                local_d8.name.d.ptr = (char16_t *)0x0;
                local_d8.paramType.d.ptr = (char16_t *)0x0;
                local_d8.paramType.d.size = 0;
                local_d8._0_8_ = (Data *)0x0;
                local_d8.paramType.d.d = (Data *)0x0;
                local_d8.name.d.size = 0;
                TraceEnum::operator=((TraceEnum *)local_158,(TraceEnum *)&local_d8);
                TraceEnum::~TraceEnum((TraceEnum *)&local_d8);
                local_424 = 0x7fffffff;
                local_428 = 0x80000000;
                bVar2 = false;
              }
              else {
                QRegularExpressionMatch::captured((QString *)&local_d8,&match_1,1);
                qVar4 = local_2f8.name.d.size;
                pcVar17 = local_2f8.name.d.ptr;
                pDVar21 = local_2f8.name.d.d;
                local_2f8.name.d.d = (Data *)local_d8._0_8_;
                local_2f8.name.d.ptr = (char16_t *)local_d8.paramType.d.d;
                local_d8._0_8_ = pDVar21;
                local_d8.paramType.d.d = (Data *)pcVar17;
                local_2f8.name.d.size = (qsizetype)local_d8.paramType.d.ptr;
                local_d8.paramType.d.ptr = (char16_t *)qVar4;
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)&local_d8);
                QList<TraceFlags>::emplaceBack<TraceFlags_const&>
                          (&__return_storage_ptr__->flags,&local_2f8);
                local_d8.name.d.d = (Data *)0x0;
                local_d8.name.d.ptr = (char16_t *)0x0;
                local_d8.paramType.d.ptr = (char16_t *)0x0;
                local_d8.paramType.d.size = 0;
                local_d8._0_8_ = (Data *)0x0;
                local_d8.paramType.d.d = (Data *)0x0;
                TraceFlags::operator=(&local_2f8,(TraceFlags *)&local_d8);
                TraceFlags::~TraceFlags((TraceFlags *)&local_d8);
                local_424 = 0x7fffffff;
                local_428 = 0x80000000;
                bVar3 = false;
              }
            }
            else {
              QString::toLocal8Bit((QByteArray *)&local_d8,filename);
              pDVar21 = local_d8.paramType.d.d;
              if (local_d8.paramType.d.d == (Data *)0x0) {
                pDVar21 = (Data *)"";
              }
              QString::toLocal8Bit((QByteArray *)&local_3c8,(QString *)&local_318);
              pcVar19 = (char *)local_3c8.name.d.ptr;
              if ((Data *)local_3c8.name.d.ptr == (Data *)0x0) {
                pcVar19 = "";
              }
              panic("Syntax error while processing \'%s\' line %d:\n    \'%s\' end of enum/flags does not match"
                    ,pDVar21,(ulong)uVar23,pcVar19);
              QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_3c8);
              QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_d8);
            }
            QRegularExpressionMatch::~QRegularExpressionMatch(&match_1);
          }
          else if (((undefined1 *)local_318.size != (undefined1 *)0x0) &&
                  (bVar10 = QString::startsWith((QString *)&local_318,(QChar)0x23,CaseSensitive),
                  !bVar10)) {
            if (bVar2) {
              m.d.d.ptr = (QExplicitlySharedDataPointer<QRegularExpressionMatchPrivate>)
                          &DAT_aaaaaaaaaaaaaaaa;
              QRegularExpression::match
                        ((QRegularExpression *)&m,(QString *)&parseProvider::enumdef,
                         (qsizetype)&local_318,NormalMatch,(MatchOptions)0x0);
              local_3c8.name.d.d = (Data *)0x0;
              local_3c8.name.d.ptr = (char16_t *)0x0;
              local_d8._0_8_ = (Data *)0x0;
              local_d8.paramType.d.d = (Data *)0x131d72;
              local_3c8.name.d.size = 0;
              local_d8.paramType.d.ptr = (char16_t *)0x5;
              bVar10 = QString::startsWith((QString *)&local_318,(QString *)&local_d8,CaseSensitive)
              ;
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)&local_d8);
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)&local_3c8);
              if (bVar10) {
                match_1.d.d.ptr =
                     (QExplicitlySharedDataPointer<QRegularExpressionMatchPrivate>)
                     &DAT_aaaaaaaaaaaaaaaa;
                QRegularExpression::match
                          ((QRegularExpression *)&match_1,(QString *)&parseProvider::rangedef,
                           (qsizetype)&local_318,NormalMatch,(MatchOptions)0x0);
                bVar10 = QRegularExpressionMatch::hasMatch(&match_1);
                if (bVar10) {
                  local_d8.paramType.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
                  local_d8._0_8_ = (Data *)0x0;
                  local_d8.paramType.d.d = (Data *)0x0;
                  local_d8.paramType.d.ptr = (char16_t *)0x0;
                  QRegularExpressionMatch::captured(&local_3c8.name,&match_1,1);
                  pcVar17 = local_d8.paramType.d.ptr;
                  pDVar21 = local_d8.paramType.d.d;
                  uVar5 = local_d8._0_8_;
                  local_d8._0_8_ = local_3c8.name.d.d;
                  local_d8.paramType.d.d = (Data *)local_3c8.name.d.ptr;
                  local_3c8.name.d.d = (Data *)uVar5;
                  local_3c8.name.d.ptr = (char16_t *)pDVar21;
                  local_d8.paramType.d.ptr = (char16_t *)local_3c8.name.d.size;
                  local_3c8.name.d.size = (qsizetype)pcVar17;
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&local_3c8);
                  QRegularExpressionMatch::captured(&local_3c8.name,&match_1,2);
                  iVar11 = QString::toInt(&local_3c8.name,(bool *)0x0,10);
                  local_d8.paramType.d.size = CONCAT44(local_d8.paramType.d.size._4_4_,iVar11);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&local_3c8);
                  QRegularExpressionMatch::captured(&local_3c8.name,&match_1,3);
                  iVar11 = QString::toInt(&local_3c8.name,(bool *)0x0,10);
                  local_d8.paramType.d.size = CONCAT44(iVar11,(uint)local_d8.paramType.d.size);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&local_3c8);
                  local_41c = local_d8.paramType.d.size._4_4_ + 1;
                  QList<TraceEnum::EnumValue>::emplaceBack<TraceEnum::EnumValue_const&>
                            ((QList<TraceEnum::EnumValue> *)(local_158 + 0x18),
                             (EnumValue *)&local_d8);
                  if ((int)local_428 <= (int)local_d8.paramType.d.size._4_4_) {
                    local_428 = local_d8.paramType.d.size._4_4_;
                  }
                  if ((int)(uint)local_d8.paramType.d.size <= (int)local_424) {
                    local_424 = (uint)local_d8.paramType.d.size;
                  }
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&local_d8);
                }
                QRegularExpressionMatch::~QRegularExpressionMatch(&match_1);
              }
              else {
LAB_0010d82d:
                bVar10 = QRegularExpressionMatch::hasMatch(&m);
                if (bVar10) {
                  bVar10 = QRegularExpressionMatch::hasCaptured(&m,3);
                  if (bVar10) {
                    if (bVar2) {
                      local_d8.paramType.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
                      local_d8._0_8_ = (Data *)0x0;
                      local_d8.paramType.d.d = (Data *)0x0;
                      local_d8.paramType.d.ptr = (char16_t *)0x0;
                      QRegularExpressionMatch::captured(&local_3c8.name,&m,1);
                      pcVar17 = local_d8.paramType.d.ptr;
                      pDVar21 = local_d8.paramType.d.d;
                      uVar5 = local_d8._0_8_;
                      local_d8._0_8_ = local_3c8.name.d.d;
                      local_d8.paramType.d.d = (Data *)local_3c8.name.d.ptr;
                      local_3c8.name.d.d = (Data *)uVar5;
                      local_3c8.name.d.ptr = (char16_t *)pDVar21;
                      local_d8.paramType.d.ptr = (char16_t *)local_3c8.name.d.size;
                      local_3c8.name.d.size = (qsizetype)pcVar17;
                      QArrayDataPointer<char16_t>::~QArrayDataPointer
                                ((QArrayDataPointer<char16_t> *)&local_3c8);
                      QRegularExpressionMatch::captured(&local_3c8.name,&m,3);
                      iVar11 = QString::toInt(&local_3c8.name,(bool *)0x0,10);
                      local_d8.paramType.d.size = CONCAT44(local_d8.paramType.d.size._4_4_,iVar11);
                      QArrayDataPointer<char16_t>::~QArrayDataPointer
                                ((QArrayDataPointer<char16_t> *)&local_3c8);
                      qVar4 = local_d8.paramType.d.size;
                      local_d8.paramType.d.size = local_d8.paramType.d.size & 0xffffffff;
                      qVar8 = local_d8.paramType.d.size;
                      local_d8.paramType.d.size._0_4_ = (uint)qVar4;
                      local_41c = (uint)local_d8.paramType.d.size + 1;
                      local_d8.paramType.d.size = qVar8;
                      QList<TraceEnum::EnumValue>::emplaceBack<TraceEnum::EnumValue_const&>
                                ((QList<TraceEnum::EnumValue> *)(local_158 + 0x18),
                                 (EnumValue *)&local_d8);
                      if ((int)local_428 <= (int)(uint)local_d8.paramType.d.size) {
                        local_428 = (uint)local_d8.paramType.d.size;
                      }
                      if ((int)(uint)local_d8.paramType.d.size <= (int)local_424) {
                        local_424 = (uint)local_d8.paramType.d.size;
                      }
                    }
                    else {
                      local_d8.paramType.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
                      local_d8._0_8_ = (Data *)0x0;
                      local_d8.paramType.d.d = (Data *)0x0;
                      local_d8.paramType.d.ptr = (char16_t *)0x0;
                      QRegularExpressionMatch::captured(&local_3c8.name,&m,1);
                      pcVar17 = local_d8.paramType.d.ptr;
                      pDVar21 = local_d8.paramType.d.d;
                      uVar5 = local_d8._0_8_;
                      local_d8._0_8_ = local_3c8.name.d.d;
                      local_d8.paramType.d.d = (Data *)local_3c8.name.d.ptr;
                      local_3c8.name.d.d = (Data *)uVar5;
                      local_3c8.name.d.ptr = (char16_t *)pDVar21;
                      local_d8.paramType.d.ptr = (char16_t *)local_3c8.name.d.size;
                      local_3c8.name.d.size = (qsizetype)pcVar17;
                      QArrayDataPointer<char16_t>::~QArrayDataPointer
                                ((QArrayDataPointer<char16_t> *)&local_3c8);
                      QRegularExpressionMatch::captured(&local_3c8.name,&m,3);
                      local_118.name.d.d = (Data *)0x0;
                      local_118.name.d.ptr = (char16_t *)0x0;
                      match_1.d.d.ptr =
                           (QExplicitlySharedDataPointer<QRegularExpressionMatchPrivate>)
                           (totally_ordered_wrapper<QRegularExpressionMatchPrivate_*>)0x0;
                      pcStack_70 = L"0x";
                      local_118.name.d.size = 0;
                      bVar10 = QString::startsWith(&local_3c8.name,(QString *)&match_1,CaseSensitive
                                                  );
                      QArrayDataPointer<char16_t>::~QArrayDataPointer
                                ((QArrayDataPointer<char16_t> *)&match_1);
                      QArrayDataPointer<char16_t>::~QArrayDataPointer
                                ((QArrayDataPointer<char16_t> *)&local_118);
                      QArrayDataPointer<char16_t>::~QArrayDataPointer
                                ((QArrayDataPointer<char16_t> *)&local_3c8);
                      if (bVar10) {
                        QRegularExpressionMatch::captured(&local_3c8.name,&m,3);
                        iVar11 = 0x10;
                      }
                      else {
                        QRegularExpressionMatch::captured(&local_3c8.name,&m,3);
                        iVar11 = 10;
                      }
                      iVar11 = QString::toInt(&local_3c8.name,(bool *)0x0,iVar11);
                      local_d8.paramType.d.size = CONCAT44(local_d8.paramType.d.size._4_4_,iVar11);
                      QArrayDataPointer<char16_t>::~QArrayDataPointer
                                ((QArrayDataPointer<char16_t> *)&local_3c8);
                      if (((uint)local_d8.paramType.d.size & (uint)local_d8.paramType.d.size - 1) ==
                          0) {
                        uVar16 = 0x20;
                        if ((uint)local_d8.paramType.d.size != 0) {
                          uVar16 = 0x1f;
                          if ((uint)local_d8.paramType.d.size != 0) {
                            for (; (uint)local_d8.paramType.d.size >> uVar16 == 0;
                                uVar16 = uVar16 - 1) {
                            }
                          }
                          uVar16 = uVar16 ^ 0x1f;
                        }
                        local_d8.paramType.d.size =
                             CONCAT44(local_d8.paramType.d.size._4_4_,0x20 - uVar16);
                        QList<TraceFlags::FlagValue>::emplaceBack<TraceFlags::FlagValue_const&>
                                  (&local_2f8.values,(FlagValue *)&local_d8);
                      }
                      else {
                        QString::toLocal8Bit((QByteArray *)&local_3c8,filename);
                        pcVar19 = (char *)local_3c8.name.d.ptr;
                        if ((Data *)local_3c8.name.d.ptr == (Data *)0x0) {
                          pcVar19 = "";
                        }
                        QString::toLocal8Bit((QByteArray *)&match_1,(QString *)&local_318);
                        printf("Warning: \'%s\' line %d:\n    \'%s\' flag value is not power of two.\n"
                               ,pcVar19,(ulong)uVar23,L"0x");
                        QArrayDataPointer<char>::~QArrayDataPointer
                                  ((QArrayDataPointer<char> *)&match_1);
                        QArrayDataPointer<char>::~QArrayDataPointer
                                  ((QArrayDataPointer<char> *)&local_3c8);
                      }
                    }
                    QArrayDataPointer<char16_t>::~QArrayDataPointer
                              ((QArrayDataPointer<char16_t> *)&local_d8);
                  }
                  else {
                    if ((int)local_428 <= (int)local_41c) {
                      local_428 = local_41c;
                    }
                    if ((int)local_41c <= (int)local_424) {
                      local_424 = local_41c;
                    }
                    if (!bVar2) {
                      QString::toLocal8Bit((QByteArray *)&local_d8,filename);
                      pDVar21 = local_d8.paramType.d.d;
                      if (local_d8.paramType.d.d == (Data *)0x0) {
                        pDVar21 = (Data *)"";
                      }
                      QString::toLocal8Bit((QByteArray *)&local_3c8,(QString *)&local_318);
                      pcVar19 = (char *)local_3c8.name.d.ptr;
                      if ((Data *)local_3c8.name.d.ptr == (Data *)0x0) {
                        pcVar19 = "";
                      }
                      fmt = 
                      "Syntax error while processing \'%s\' line %d:\n    \'%s\' flags value not set"
                      ;
                      goto LAB_0010e70f;
                    }
                    QRegularExpressionMatch::captured((QString *)&local_d8,&m,0);
                    local_d8.paramType.d.size = (qsizetype)local_41c;
                    QList<TraceEnum::EnumValue>::emplaceBack<TraceEnum::EnumValue>
                              ((QList<TraceEnum::EnumValue> *)(local_158 + 0x18),
                               (EnumValue *)&local_d8);
                    QArrayDataPointer<char16_t>::~QArrayDataPointer
                              ((QArrayDataPointer<char16_t> *)&local_d8);
                    local_41c = local_41c + 1;
                  }
                }
                else {
                  QString::toLocal8Bit((QByteArray *)&local_d8,filename);
                  pDVar21 = local_d8.paramType.d.d;
                  if (local_d8.paramType.d.d == (Data *)0x0) {
                    pDVar21 = (Data *)"";
                  }
                  QString::toLocal8Bit((QByteArray *)&local_3c8,(QString *)&local_318);
                  pcVar19 = (char *)local_3c8.name.d.ptr;
                  if ((Data *)local_3c8.name.d.ptr == (Data *)0x0) {
                    pcVar19 = "";
                  }
                  fmt = 
                  "Syntax error while processing \'%s\' line %d:\n    \'%s\' enum/flags does not match"
                  ;
LAB_0010e70f:
                  panic(fmt,pDVar21,(ulong)uVar23,pcVar19);
                  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_3c8)
                  ;
                  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_d8);
                }
              }
              QRegularExpressionMatch::~QRegularExpressionMatch(&m);
            }
            else {
              if (bVar3) {
                m.d.d.ptr = (QExplicitlySharedDataPointer<QRegularExpressionMatchPrivate>)
                            &DAT_aaaaaaaaaaaaaaaa;
                QRegularExpression::match
                          ((QRegularExpression *)&m,(QString *)&parseProvider::enumdef,
                           (qsizetype)&local_318,NormalMatch,(MatchOptions)0x0);
                goto LAB_0010d82d;
              }
              match.d.d.ptr =
                   (QExplicitlySharedDataPointer<QRegularExpressionMatchPrivate>)
                   &DAT_aaaaaaaaaaaaaaaa;
              QRegularExpression::match
                        ((QRegularExpression *)&match,(QString *)&parseProvider::tracedef,
                         (qsizetype)&local_318,NormalMatch,(MatchOptions)0x0);
              bVar10 = QRegularExpressionMatch::hasMatch(&match);
              if (bVar10) {
                local_338.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
                local_338.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
                local_338.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
                QRegularExpressionMatch::captured((QString *)&local_338,&match,1);
                local_358.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
                local_358.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
                local_358.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
                QRegularExpressionMatch::captured((QString *)&local_358,&match,2);
                local_378.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
                local_378.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
                local_378.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
                QString::split((QStringList *)&local_378,(QString *)&local_358,(QChar)0x2c,
                               (SplitBehavior)0x1,CaseSensitive);
                local_3c8.name.d.d = (Data *)0x0;
                local_3c8.name.d.ptr = (char16_t *)0x0;
                local_3c8.name.d.size = 0;
                local_3c8.args.d.d = (Data *)0x0;
                local_3c8.args.d.ptr = (Argument *)0x0;
                local_3c8.args.d.size = 0;
                local_3c8.fields.d.d = (Data *)0x0;
                local_3c8.fields.d.ptr = (Field *)0x0;
                local_3c8.fields.d.size = 0;
                QString::operator=(&local_3c8.name,(QString *)&local_338);
                qVar4 = local_378.size;
                offset = local_378.ptr;
                if ((undefined1 *)local_378.size != (undefined1 *)0x0) {
                  if ((parseTracepoint(Provider_const&,QString_const&,QList<QString>const&,QString_const&,int)
                       ::rx == '\0') &&
                     (iVar11 = __cxa_guard_acquire(&
                                                  parseTracepoint(Provider_const&,QString_const&,QList<QString>const&,QString_const&,int)
                                                  ::rx), iVar11 != 0)) {
                    match_1.d.d.ptr =
                         (QExplicitlySharedDataPointer<QRegularExpressionMatchPrivate>)
                         (totally_ordered_wrapper<QRegularExpressionMatchPrivate_*>)0x0;
                    pcStack_70 = (char16_t *)0x0;
                    local_d8._0_8_ = (Data *)0x0;
                    local_d8.paramType.d.d = (Data *)0x131d84;
                    local_d8.paramType.d.ptr = (char16_t *)0x20;
                    QRegularExpression::QRegularExpression
                              ((QRegularExpression *)
                               &parseTracepoint(Provider_const&,QString_const&,QList<QString>const&,QString_const&,int)
                                ::rx,(QString *)&local_d8,(PatternOptions)0x0);
                    QArrayDataPointer<char16_t>::~QArrayDataPointer
                              ((QArrayDataPointer<char16_t> *)&local_d8);
                    QArrayDataPointer<char16_t>::~QArrayDataPointer
                              ((QArrayDataPointer<char16_t> *)&match_1);
                    __cxa_atexit(QRegularExpression::~QRegularExpression,
                                 &parseTracepoint(Provider_const&,QString_const&,QList<QString>const&,QString_const&,int)
                                  ::rx,&__dso_handle);
                    __cxa_guard_release(&parseTracepoint(Provider_const&,QString_const&,QList<QString>const&,QString_const&,int)
                                         ::rx);
                  }
                  pQVar13 = offset + qVar4;
                  for (; offset != pQVar13; offset = offset + 1) {
                    match_2.d.d.ptr =
                         (QExplicitlySharedDataPointer<QRegularExpressionMatchPrivate>)
                         &DAT_aaaaaaaaaaaaaaaa;
                    QRegularExpression::match
                              ((QRegularExpression *)&match_2,
                               (QString *)
                               &parseTracepoint(Provider_const&,QString_const&,QList<QString>const&,QString_const&,int)
                                ::rx,(qsizetype)offset,NormalMatch,(MatchOptions)0x0);
                    local_1f8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
                    local_1f8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
                    local_1f8.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
                    QRegularExpressionMatch::captured((QString *)&local_d8,&match_2,1);
                    QString::trimmed_helper((QString *)&local_1f8,(QString *)&local_d8);
                    QArrayDataPointer<char16_t>::~QArrayDataPointer
                              ((QArrayDataPointer<char16_t> *)&local_d8);
                    if (local_1f8.ptr == (char16_t *)0x0) {
                      QString::toLocal8Bit((QByteArray *)&local_d8,(QString *)&local_338);
                      pDVar21 = local_d8.paramType.d.d;
                      if (local_d8.paramType.d.d == (Data *)0x0) {
                        pDVar21 = (Data *)"";
                      }
                      QString::toLocal8Bit((QByteArray *)&match_1,filename);
                      pcVar17 = pcStack_70;
                      if (pcStack_70 == (char16_t *)0x0) {
                        pcVar17 = (char16_t *)"";
                      }
                      panic("Missing parameter type for argument %d of %s (%s:%d)",0,pDVar21,pcVar17
                           );
                      QArrayDataPointer<char>::~QArrayDataPointer
                                ((QArrayDataPointer<char> *)&match_1);
                      QArrayDataPointer<char>::~QArrayDataPointer
                                ((QArrayDataPointer<char> *)&local_d8);
                    }
                    local_218.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
                    local_218.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
                    local_218.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
                    QRegularExpressionMatch::captured((QString *)&local_d8,&match_2,2);
                    QString::trimmed_helper((QString *)&local_218,(QString *)&local_d8);
                    QArrayDataPointer<char16_t>::~QArrayDataPointer
                              ((QArrayDataPointer<char16_t> *)&local_d8);
                    if (local_218.ptr == (char16_t *)0x0) {
                      QString::toLocal8Bit((QByteArray *)&local_d8,(QString *)&local_218);
                      pDVar21 = local_d8.paramType.d.d;
                      if (local_d8.paramType.d.d == (Data *)0x0) {
                        pDVar21 = (Data *)"";
                      }
                      QString::toLocal8Bit((QByteArray *)&match_1,filename);
                      if (pcStack_70 == (char16_t *)0x0) {
                        pcStack_70 = (char16_t *)"";
                      }
                      panic("Missing parameter name for argument %d of %s (%s:%d)",0,pDVar21,
                            pcStack_70);
                      QArrayDataPointer<char>::~QArrayDataPointer
                                ((QArrayDataPointer<char> *)&match_1);
                      QArrayDataPointer<char>::~QArrayDataPointer
                                ((QArrayDataPointer<char> *)&local_d8);
                    }
                    iVar11 = arrayLength((QString *)&local_1f8);
                    match_1.d.d.ptr =
                         (QExplicitlySharedDataPointer<QRegularExpressionMatchPrivate>)
                         (totally_ordered_wrapper<QRegularExpressionMatchPrivate_*>)0x0;
                    QStack_60.d.d = (Data *)0x0;
                    QStack_60.d.ptr = (char16_t *)0x0;
                    QStack_60.d.size = 0;
                    uStack_44 = 0xaaaaaaaa;
                    local_48 = iVar11;
                    QString::operator=(&QStack_60,(QString *)&local_218);
                    local_230.d = local_1f8.d;
                    local_230.ptr._0_4_ = local_1f8.ptr._0_4_;
                    local_230.ptr._4_4_ = local_1f8.ptr._4_4_;
                    local_230.size._0_4_ = (undefined4)local_1f8.size;
                    local_230.size._4_4_ = local_1f8.size._4_4_;
                    if (local_1f8.d != (Data *)0x0) {
                      LOCK();
                      ((local_1f8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                           = ((local_1f8.d)->super_QArrayData).ref_._q_value.
                             super___atomic_base<int>._M_i + 1;
                      UNLOCK();
                    }
                    if ((decayArrayToPointer(QString)::rx == '\0') &&
                       (iVar12 = __cxa_guard_acquire(&decayArrayToPointer(QString)::rx), iVar12 != 0
                       )) {
                      local_118.name.d.d = (Data *)0x0;
                      local_118.name.d.ptr = (char16_t *)0x0;
                      local_d8._0_8_ = (Data *)0x0;
                      local_d8.paramType.d.d = (Data *)0x131de0;
                      local_118.name.d.size = 0;
                      local_d8.paramType.d.ptr = (char16_t *)0xc;
                      QRegularExpression::QRegularExpression
                                ((QRegularExpression *)&decayArrayToPointer(QString)::rx,
                                 (QString *)&local_d8,(PatternOptions)0x0);
                      QArrayDataPointer<char16_t>::~QArrayDataPointer
                                ((QArrayDataPointer<char16_t> *)&local_d8);
                      QArrayDataPointer<char16_t>::~QArrayDataPointer
                                ((QArrayDataPointer<char16_t> *)&local_118);
                      __cxa_atexit(QRegularExpression::~QRegularExpression,
                                   &decayArrayToPointer(QString)::rx,&__dso_handle);
                      __cxa_guard_release(&decayArrayToPointer(QString)::rx);
                    }
                    local_118.name.d.d = (Data *)0x0;
                    local_118.name.d.ptr = (char16_t *)0x0;
                    local_d8._0_8_ = (Data *)0x0;
                    local_d8.paramType.d.d = (Data *)0x131e1c;
                    local_118.name.d.size = 0;
                    local_d8.paramType.d.ptr = (char16_t *)0x1;
                    pQVar14 = QString::replace((QString *)&local_230,
                                               (QRegularExpression *)
                                               &decayArrayToPointer(QString)::rx,
                                               (QString *)&local_d8);
                    m.d.d.ptr = (QExplicitlySharedDataPointer<QRegularExpressionMatchPrivate>)
                                (pQVar14->d).d;
                    pcStack_70 = (pQVar14->d).ptr;
                    if (m.d.d.ptr != (totally_ordered_wrapper<QRegularExpressionMatchPrivate_*>)0x0)
                    {
                      LOCK();
                      *(int *)m.d.d.ptr = *(int *)m.d.d.ptr + 1;
                      UNLOCK();
                    }
                    QArrayDataPointer<char16_t>::~QArrayDataPointer
                              ((QArrayDataPointer<char16_t> *)&local_d8);
                    QArrayDataPointer<char16_t>::~QArrayDataPointer
                              ((QArrayDataPointer<char16_t> *)&local_118);
                    QVar9 = match_1;
                    match_1 = m;
                    m = QVar9;
                    QArrayDataPointer<char16_t>::~QArrayDataPointer
                              ((QArrayDataPointer<char16_t> *)&m);
                    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_230);
                    QList<Tracepoint::Argument>::emplaceBack<Tracepoint::Argument>
                              (&local_3c8.args,(Argument *)&match_1);
                    local_d8.arrayLen = -0x55555556;
                    local_d8.enumValueSize = -0x55555556;
                    local_d8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
                    local_d8.seqLen.d.size = 0;
                    local_d8.seqLen.d.d = (Data *)0x0;
                    local_d8.seqLen.d.ptr = (char16_t *)0x0;
                    local_d8.name.d.ptr = (char16_t *)0x0;
                    local_d8.name.d.size = 0;
                    local_d8.paramType.d.size = 0;
                    local_d8.name.d.d = (Data *)0x0;
                    local_d8.paramType.d.d = (Data *)0x0;
                    local_d8.paramType.d.ptr = (char16_t *)0x0;
                    s1 = (__return_storage_ptr__->enumerations).d.ptr;
                    for (lVar22 = (__return_storage_ptr__->enumerations).d.size * 0x38; lVar22 != 0;
                        lVar22 = lVar22 + -0x38) {
                      bVar10 = comparesEqual(&s1->name,(QString *)&local_1f8);
                      if (bVar10) {
                        TraceEnum::TraceEnum(&local_118,s1);
                        goto LAB_0010df59;
                      }
                      s1 = s1 + 1;
                    }
                    local_118.values.d.ptr = (EnumValue *)0x0;
                    local_118.values.d.size = 0;
                    local_118.name.d.size = 0;
                    local_118.values.d.d = (Data *)0x0;
                    local_118.name.d.d = (Data *)0x0;
                    local_118.name.d.ptr = (char16_t *)0x0;
                    local_118.valueSize = 0;
                    local_118._52_4_ = 0;
LAB_0010df59:
                    s1_00 = (__return_storage_ptr__->flags).d.ptr;
                    for (lVar22 = (__return_storage_ptr__->flags).d.size * 0x30; lVar22 != 0;
                        lVar22 = lVar22 + -0x30) {
                      bVar10 = comparesEqual(&s1_00->name,(QString *)&local_1f8);
                      if (bVar10) {
                        TraceFlags::TraceFlags((TraceFlags *)&m,s1_00);
                        goto LAB_0010dfb2;
                      }
                      s1_00 = s1_00 + 1;
                    }
                    m.d.d.ptr = (QExplicitlySharedDataPointer<QRegularExpressionMatchPrivate>)
                                (totally_ordered_wrapper<QRegularExpressionMatchPrivate_*>)0x0;
LAB_0010dfb2:
                    if (local_118.name.d.size == 0) {
                      local_288.d = local_1f8.d;
                      local_288.ptr = local_1f8.ptr;
                      local_288.size = local_1f8.size;
                      if (local_1f8.d != (Data *)0x0) {
                        LOCK();
                        ((local_1f8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                        _M_i = ((local_1f8.d)->super_QArrayData).ref_._q_value.
                               super___atomic_base<int>._M_i + 1;
                        UNLOCK();
                      }
                      iVar12 = arrayLength((QString *)&local_288);
                      if (0 < iVar12) {
                        local_190.d = local_288.d;
                        local_190.ptr = local_288.ptr;
                        local_190.size = local_288.size;
                        if (local_288.d != (Data *)0x0) {
                          LOCK();
                          ((local_288.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                          _M_i = ((local_288.d)->super_QArrayData).ref_._q_value.
                                 super___atomic_base<int>._M_i + 1;
                          UNLOCK();
                        }
                        removeBraces((QString *)&local_178,(QString *)&local_190);
                        qVar4 = local_288.size;
                        pcVar17 = local_288.ptr;
                        pDVar21 = local_288.d;
                        local_288.d = local_178.d;
                        local_288.ptr = local_178.ptr;
                        local_178.d = pDVar21;
                        local_178.ptr = pcVar17;
                        local_288.size = local_178.size;
                        local_178.size = qVar4;
                        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_178);
                        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_190);
                      }
                      sequenceLength((QString *)&local_178,(QString *)&local_288);
                      pcVar17 = local_178.ptr;
                      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_178);
                      uVar15 = 0;
                      if (pcVar17 == (char16_t *)0x0) {
                        if ((backendType(QString)::constMatch == '\0') &&
                           (iVar12 = __cxa_guard_acquire(&backendType(QString)::constMatch),
                           iVar12 != 0)) {
                          local_1a8.d = (Data *)0x0;
                          local_1a8.ptr = (char16_t *)0x0;
                          local_178.d = (Data *)0x0;
                          local_178.ptr = L"\\bconst\\b";
                          local_1a8.size = 0;
                          local_178.size = 9;
                          QRegularExpression::QRegularExpression
                                    ((QRegularExpression *)&backendType(QString)::constMatch,
                                     (QString *)&local_178,(PatternOptions)0x0);
                          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_178);
                          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1a8);
                          __cxa_atexit(QRegularExpression::~QRegularExpression,
                                       &backendType(QString)::constMatch,&__dso_handle);
                          __cxa_guard_release(&backendType(QString)::constMatch);
                        }
                        QString::remove((QString *)&local_288,
                                        (char *)&backendType(QString)::constMatch);
                        QString::remove((QString *)&local_288,(char *)0x26);
                        if ((backendType(QString)::ptrMatch == '\0') &&
                           (iVar12 = __cxa_guard_acquire(&backendType(QString)::ptrMatch),
                           iVar12 != 0)) {
                          local_1a8.d = (Data *)0x0;
                          local_1a8.ptr = (char16_t *)0x0;
                          local_178.d = (Data *)0x0;
                          local_178.ptr = L"\\s*\\*\\s*";
                          local_1a8.size = 0;
                          local_178.size = 8;
                          QRegularExpression::QRegularExpression
                                    ((QRegularExpression *)&backendType(QString)::ptrMatch,
                                     (QString *)&local_178,(PatternOptions)0x0);
                          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_178);
                          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1a8);
                          __cxa_atexit(QRegularExpression::~QRegularExpression,
                                       &backendType(QString)::ptrMatch,&__dso_handle);
                          __cxa_guard_release(&backendType(QString)::ptrMatch);
                        }
                        local_1a8.d = (Data *)0x0;
                        local_1a8.ptr = (char16_t *)0x0;
                        local_178.d = (Data *)0x0;
                        local_178.ptr = L"_ptr";
                        local_1a8.size = 0;
                        local_178.size = 4;
                        QString::replace((QString *)&local_288,
                                         (QRegularExpression *)&backendType(QString)::ptrMatch,
                                         (QString *)&local_178);
                        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_178);
                        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1a8);
                        QString::trimmed_helper((QString *)&local_178,(QString *)&local_288);
                        qVar4 = local_288.size;
                        pcVar17 = local_288.ptr;
                        pDVar21 = local_288.d;
                        local_288.d = local_178.d;
                        local_288.ptr = local_178.ptr;
                        local_178.d = pDVar21;
                        local_178.ptr = pcVar17;
                        local_288.size = local_178.size;
                        local_178.size = qVar4;
                        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_178);
                        local_178.d = (Data *)0x0;
                        local_1a8.d = (Data *)0x0;
                        local_1a8.ptr = (char16_t *)0x0;
                        local_1a8.size = 0;
                        local_178.ptr = L" ";
                        local_178.size = 1;
                        local_1d8.d = (Data *)0x0;
                        local_1d8.ptr = (char16_t *)0x0;
                        local_1c0.d = (Data *)0x0;
                        local_1c0.ptr = L"_";
                        local_1d8.size = 0;
                        local_1c0.size = 1;
                        QString::replace((QString *)&local_288,(QString *)&local_178,
                                         (QString *)&local_1c0,CaseSensitive);
                        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1c0);
                        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1d8);
                        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_178);
                        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1a8);
                        local_178.d = (Data *)0x131c08;
                        local_178.ptr = (char16_t *)0x8;
                        bVar10 = operator==((QString *)&local_288,(QLatin1StringView *)&local_178);
                        uVar15 = 5;
                        if (!bVar10) {
                          s_01.m_size = 4;
                          s_01.m_data = "_ptr";
                          bVar10 = QString::endsWith((QString *)&local_288,s_01,CaseSensitive);
                          uVar15 = 6;
                          if (!bVar10) {
                            lVar22 = 0;
                            do {
                              lVar18 = lVar22;
                              if (lVar18 + 0x10 == 0x270) {
                                uVar15 = 0x10;
                                goto LAB_0010e348;
                              }
                              QLatin1StringView::QLatin1StringView
                                        ((QLatin1StringView *)&local_178,
                                         *(char **)((long)&backendType(QString)::typeTable + lVar18)
                                        );
                              bVar10 = operator==((QString *)&local_288,
                                                  (QLatin1StringView *)&local_178);
                              lVar22 = lVar18 + 0x10;
                            } while (!bVar10);
                            uVar15 = *(undefined4 *)((long)&DAT_00187ff8 + lVar18);
                          }
                        }
                      }
LAB_0010e348:
                      local_d8.backendType = uVar15;
                      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_288);
                    }
                    else {
                      local_d8.backendType = 0xe;
                      local_d8.enumValueSize = local_118.valueSize;
                    }
                    local_2a0.d = local_1f8.d;
                    local_2a0.ptr = local_1f8.ptr;
                    local_2a0.size = local_1f8.size;
                    if (local_1f8.d != (Data *)0x0) {
                      LOCK();
                      ((local_1f8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                           = ((local_1f8.d)->super_QArrayData).ref_._q_value.
                             super___atomic_base<int>._M_i + 1;
                      UNLOCK();
                    }
                    removeBraces((QString *)&local_178,(QString *)&local_2a0);
                    qVar4 = local_d8.paramType.d.size;
                    pcVar17 = local_d8.paramType.d.ptr;
                    pDVar21 = local_d8.paramType.d.d;
                    local_d8.paramType.d.d = local_178.d;
                    local_d8.paramType.d.ptr = local_178.ptr;
                    local_178.d = pDVar21;
                    local_178.ptr = pcVar17;
                    local_d8.paramType.d.size = local_178.size;
                    local_178.size = qVar4;
                    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_178);
                    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_2a0);
                    QString::operator=(&local_d8.name,(QString *)&local_218);
                    local_d8.arrayLen = iVar11;
                    sequenceLength((QString *)&local_178,(QString *)&local_1f8);
                    qVar4 = local_d8.seqLen.d.size;
                    pcVar17 = local_d8.seqLen.d.ptr;
                    pDVar21 = local_d8.seqLen.d.d;
                    local_d8.seqLen.d.d = local_178.d;
                    local_d8.seqLen.d.ptr = local_178.ptr;
                    local_178.d = pDVar21;
                    local_178.ptr = pcVar17;
                    local_d8.seqLen.d.size = local_178.size;
                    local_178.size = qVar4;
                    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_178);
                    QList<Tracepoint::Field>::emplaceBack<Tracepoint::Field>
                              (&local_3c8.fields,&local_d8);
                    TraceFlags::~TraceFlags((TraceFlags *)&m);
                    TraceEnum::~TraceEnum(&local_118);
                    Tracepoint::Field::~Field(&local_d8);
                    Tracepoint::Argument::~Argument((Argument *)&match_1);
                    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_218);
                    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1f8);
                    QRegularExpressionMatch::~QRegularExpressionMatch(&match_2);
                  }
                }
                QList<Tracepoint>::emplaceBack<Tracepoint>
                          (&__return_storage_ptr__->tracepoints,&local_3c8);
                Tracepoint::~Tracepoint(&local_3c8);
                QArrayDataPointer<QString>::~QArrayDataPointer(&local_378);
                QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_358);
                QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_338);
              }
              else {
                QString::toLocal8Bit((QByteArray *)&local_d8,filename);
                pDVar21 = local_d8.paramType.d.d;
                if (local_d8.paramType.d.d == (Data *)0x0) {
                  pDVar21 = (Data *)"";
                }
                QString::toLocal8Bit((QByteArray *)&local_3c8,(QString *)&local_318);
                pcVar19 = (char *)local_3c8.name.d.ptr;
                if ((Data *)local_3c8.name.d.ptr == (Data *)0x0) {
                  pcVar19 = "";
                }
                panic("Syntax error while processing \'%s\' line %d:\n    \'%s\' does not look like a tracepoint definition"
                      ,pDVar21,(ulong)uVar23,pcVar19);
                QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_3c8);
                QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_d8);
              }
              QRegularExpressionMatch::~QRegularExpressionMatch(&match);
            }
          }
        }
      }
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_318);
    uVar23 = uVar23 + 1;
  } while( true );
}

Assistant:

Provider parseProvider(const QString &filename)
{
    QFile f(filename);

    if (!f.open(QIODevice::ReadOnly | QIODevice::Text))
        panic("Cannot open %s: %s", qPrintable(filename), qPrintable(f.errorString()));

    QTextStream s(&f);

    static const QRegularExpression tracedef(QStringLiteral("^([A-Za-z][A-Za-z0-9_]*)\\((.*)\\)$"));
    static const QRegularExpression enumenddef(QStringLiteral("^} ?([A-Za-z][A-Za-z0-9_:]*);"));
    static const QRegularExpression enumdef(QStringLiteral("^([A-Za-z][A-Za-z0-9_]*)( *= *([xabcdef0-9]*))?"));
    static const QRegularExpression rangedef(QStringLiteral("^RANGE\\(([A-Za-z][A-Za-z0-9_]*) ?, ?([0-9]*) ?... ?([0-9]*) ?\\)"));

    Provider provider;
    provider.name = QFileInfo(filename).baseName();

    bool parsingPrefixText = false;
    bool parsingEnum = false;
    bool parsingFlags = false;
    TraceEnum currentEnum;
    TraceFlags currentFlags;
    int currentEnumValue = 0;
    int minEnumValue = std::numeric_limits<int>::max();
    int maxEnumValue = std::numeric_limits<int>::min();
    for (int lineNumber = 1; !s.atEnd(); ++lineNumber) {
        QString line = s.readLine().trimmed();

        if (line == "{"_L1) {
            parsingPrefixText = true;
            continue;
        } else if (parsingPrefixText && line == "}"_L1) {
            parsingPrefixText = false;
            continue;
        } else if (parsingPrefixText) {
            provider.prefixText.append(line);
            continue;
        } else if (line == "ENUM {"_L1) {
            parsingEnum = true;
            continue;
        } else if (line == "FLAGS {"_L1) {
            parsingFlags = true;
            continue;
        } else if (line.startsWith("}"_L1) && (parsingEnum || parsingFlags)) {
            auto match = enumenddef.match(line);
            if (match.hasMatch()) {
                if (parsingEnum) {
                    currentEnum.name = match.captured(1);
                    currentEnum.valueSize = minumumValueSize(minEnumValue, maxEnumValue);
                    provider.enumerations.push_back(currentEnum);
                    currentEnum = TraceEnum();
                    parsingEnum = false;
                } else {
                    currentFlags.name = match.captured(1);
                    provider.flags.push_back(currentFlags);
                    currentFlags = TraceFlags();
                    parsingFlags = false;
                }

                minEnumValue = std::numeric_limits<int>::max();
                maxEnumValue = std::numeric_limits<int>::min();
            } else {
                panic("Syntax error while processing '%s' line %d:\n"
                      "    '%s' end of enum/flags does not match",
                      qPrintable(filename), lineNumber,
                      qPrintable(line));
            }

            continue;
        }

        if (line.isEmpty() || line.startsWith(u'#'))
            continue;

        if (parsingEnum || parsingFlags) {
            auto m = enumdef.match(line);
            if (parsingEnum && line.startsWith(QStringLiteral("RANGE"))) {
                auto m = rangedef.match(line);
                if (m.hasMatch()) {
                    TraceEnum::EnumValue value;
                    value.name = m.captured(1);
                    value.value = m.captured(2).toInt();
                    value.range = m.captured(3).toInt();
                    currentEnumValue = value.range + 1;
                    currentEnum.values.push_back(value);
                    maxEnumValue = qMax(maxEnumValue, value.range);
                    minEnumValue = qMin(minEnumValue, value.value);
                }
            } else if (m.hasMatch()) {
                if (m.hasCaptured(3)) {
                    if (parsingEnum) {
                        TraceEnum::EnumValue value;
                        value.name = m.captured(1);
                        value.value = m.captured(3).toInt();
                        value.range = 0;
                        currentEnumValue = value.value + 1;
                        currentEnum.values.push_back(value);
                        maxEnumValue = qMax(maxEnumValue, value.value);
                        minEnumValue = qMin(minEnumValue, value.value);
                    } else {
                        TraceFlags::FlagValue value;
                        value.name = m.captured(1);
                        if (m.captured(3).startsWith(QStringLiteral("0x")))
                            value.value = m.captured(3).toInt(nullptr, 16);
                        else
                            value.value = m.captured(3).toInt();
                        if (!isPow2OrZero(value.value)) {
                            printf("Warning: '%s' line %d:\n"
                                  "    '%s' flag value is not power of two.\n",
                                  qPrintable(filename), lineNumber,
                                  qPrintable(line));
                        } else {
                            value.value = pow2Log2(value.value);
                            currentFlags.values.push_back(value);
                        }
                    }
                } else {
                    maxEnumValue = qMax(maxEnumValue, currentEnumValue);
                    minEnumValue = qMin(minEnumValue, currentEnumValue);
                    if (parsingEnum) {
                        currentEnum.values.push_back({m.captured(0), currentEnumValue++, 0});
                    } else {
                        panic("Syntax error while processing '%s' line %d:\n"
                              "    '%s' flags value not set",
                              qPrintable(filename), lineNumber,
                              qPrintable(line));
                    }
                }
            } else {
                panic("Syntax error while processing '%s' line %d:\n"
                      "    '%s' enum/flags does not match",
                      qPrintable(filename), lineNumber,
                      qPrintable(line));
            }
            continue;
        }

        auto match = tracedef.match(line);
        if (match.hasMatch()) {
            const QString name = match.captured(1);
            const QString argsString = match.captured(2);
            const QStringList args = argsString.split(u',', Qt::SkipEmptyParts);

            provider.tracepoints << parseTracepoint(provider, name, args, filename, lineNumber);
        } else {
            panic("Syntax error while processing '%s' line %d:\n"
                  "    '%s' does not look like a tracepoint definition",
                  qPrintable(filename), lineNumber,
                  qPrintable(line));
        }
    }

    if (parsingPrefixText) {
        panic("Syntax error while processing '%s': "
              "no closing brace found for prefix text block",
              qPrintable(filename));
    }

#ifdef TRACEGEN_DEBUG
    qDebug() << provider.prefixText;
    for (auto i = provider.tracepoints.constBegin(); i != provider.tracepoints.constEnd(); ++i)
        dumpTracepoint(*i);
#endif

    return provider;
}